

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

bool __thiscall
ON_PointCloud::GetClosestPoint
          (ON_PointCloud *this,ON_3dPoint P,int *closest_point_index,double maximum_distance)

{
  bool bVar1;
  double dVar2;
  double maximum_distance_local;
  int *closest_point_index_local;
  ON_PointCloud *this_local;
  
  if (((maximum_distance <= 0.0) || (bVar1 = ON_BoundingBox::IsValid(&this->m_bbox), !bVar1)) ||
     (dVar2 = ON_BoundingBox::MinimumDistanceTo(&this->m_bbox,&P), dVar2 <= maximum_distance)) {
    this_local._7_1_ =
         ON_3dPointArray::GetClosestPoint(&this->m_P,P,closest_point_index,maximum_distance);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PointCloud::GetClosestPoint(
                ON_3dPoint P,
                int* closest_point_index,
                double maximum_distance 
                ) const
{
  if ( maximum_distance > 0.0 && m_bbox.IsValid() )
  {
    // check bounding box
    if ( m_bbox.MinimumDistanceTo(P) > maximum_distance )
      return false;
  }
  return m_P.GetClosestPoint( P, closest_point_index, maximum_distance );
}